

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

bool PIT_FindFloorCeiling
               (FMultiBlockLinesIterator *mit,CheckResult *cres,FBoundingBox *box,
               FCheckPosition *tmf,int flags)

{
  double pos;
  bool bVar1;
  int iVar2;
  undefined1 local_f0 [8];
  FLineOpening open;
  undefined1 local_50 [8];
  DVector2 refpoint;
  line_t *ld;
  int flags_local;
  FCheckPosition *tmf_local;
  FBoundingBox *box_local;
  CheckResult *cres_local;
  FMultiBlockLinesIterator *mit_local;
  
  refpoint.Y = (double)cres->line;
  bVar1 = FBoundingBox::inRange(box,(line_t *)refpoint.Y);
  if ((bVar1) && (iVar2 = FBoundingBox::BoxOnLineSide(box,(line_t *)refpoint.Y), iVar2 == -1)) {
    if ((ffcf_verbose & 1U) != 0) {
      Printf("Hit line %d at position %f,%f, group %d\n",(cres->Position).X,(cres->Position).Y,
             ((long)refpoint.Y - (long)lines) / 0x98 & 0xffffffff,
             (ulong)*(uint *)(*(long *)((long)refpoint.Y + 0x78) + 0x1f8));
    }
    pos = refpoint.Y;
    if (*(long *)((long)refpoint.Y + 0x80) != 0) {
      TVector2<double>::TVector2((TVector2<double> *)&open.floorterrain,&cres->Position);
      FindRefPoint((line_t *)local_50,(DVector2 *)pos);
      FLineOpening::FLineOpening((FLineOpening *)local_f0);
      P_LineOpening((FLineOpening *)local_f0,tmf->thing,(line_t *)refpoint.Y,(DVector2 *)local_50,
                    &cres->Position,flags);
      if (((flags & 0x40U) == 0) && ((double)local_f0 < tmf->ceilingz)) {
        tmf->ceilingz = (double)local_f0;
        if (open.bottomsec != (sector_t *)0x0) {
          tmf->ceilingsector = open.bottomsec;
        }
        if ((ffcf_verbose & 1U) != 0) {
          Printf("    Adjust ceilingz to %f\n",local_f0);
        }
        FMultiBlockLinesIterator::StopUp(mit);
      }
      if ((flags & 0x20U) == 0) {
        if (open.top < tmf->floorz || open.top == tmf->floorz) {
          if ((open.top == tmf->floorz) && (!NAN(open.top) && !NAN(tmf->floorz))) {
            tmf->touchmidtex =
                 (tmf->touchmidtex & 1U) != 0 || (open.backfloorplane.negiC._4_1_ & 1) != 0;
            tmf->abovemidtex =
                 (tmf->abovemidtex & 1U) != 0 || (open.backfloorplane.negiC._5_1_ & 1) != 0;
          }
        }
        else {
          tmf->floorz = open.top;
          if (open.lowfloor != 0.0) {
            tmf->floorsector = (sector_t *)open.lowfloor;
          }
          tmf->touchmidtex = (bool)(open.backfloorplane.negiC._4_1_ & 1);
          tmf->abovemidtex = (bool)(open.backfloorplane.negiC._5_1_ & 1);
          if ((ffcf_verbose & 1U) != 0) {
            Printf("    Adjust floorz to %f\n",open.top);
          }
          if (tmf->dropoffz + tmf->thing->MaxDropOffHeight < tmf->floorz) {
            FMultiBlockLinesIterator::StopDown(mit);
          }
        }
        if ((open.range < tmf->dropoffz) && (-3.4028234663852886e+38 < open.range)) {
          tmf->dropoffz = open.range;
          if ((ffcf_verbose & 1U) != 0) {
            Printf("    Adjust dropoffz to %f\n",open.top);
          }
          if (tmf->dropoffz + tmf->thing->MaxDropOffHeight < tmf->floorz) {
            FMultiBlockLinesIterator::StopDown(mit);
          }
        }
      }
    }
  }
  return true;
}

Assistant:

static bool PIT_FindFloorCeiling(FMultiBlockLinesIterator &mit, FMultiBlockLinesIterator::CheckResult &cres, const FBoundingBox &box, FCheckPosition &tmf, int flags)
{
	line_t *ld = cres.line;

	if (!box.inRange(ld) || box.BoxOnLineSide(ld) != -1)
		return true;

	// A line has been hit

	if (ffcf_verbose)
	{
		Printf("Hit line %d at position %f,%f, group %d\n",
			int(ld - lines), cres.Position.X, cres.Position.Y, ld->frontsector->PortalGroup);
	}

	if (!ld->backsector)
	{ // One sided line
		return true;
	}

	DVector2 refpoint = FindRefPoint(ld, cres.Position);
	FLineOpening open;

	P_LineOpening(open, tmf.thing, ld, refpoint, &cres.Position, flags);

	// adjust floor / ceiling heights
	if (!(flags & FFCF_NOCEILING))
	{
		if (open.top < tmf.ceilingz)
		{
			tmf.ceilingz = open.top;
			if (open.topsec != NULL) tmf.ceilingsector = open.topsec;
			if (ffcf_verbose) Printf("    Adjust ceilingz to %f\n", open.top);
			mit.StopUp();
		}
	}

	if (!(flags & FFCF_NOFLOOR))
	{
		if (open.bottom > tmf.floorz)
		{
			tmf.floorz = open.bottom;
			if (open.bottomsec != NULL) tmf.floorsector = open.bottomsec;
			tmf.touchmidtex = open.touchmidtex;
			tmf.abovemidtex = open.abovemidtex;
			if (ffcf_verbose) Printf("    Adjust floorz to %f\n", open.bottom);
			if (tmf.floorz > tmf.dropoffz + tmf.thing->MaxDropOffHeight) mit.StopDown();
		}
		else if (open.bottom == tmf.floorz)
		{
			tmf.touchmidtex |= open.touchmidtex;
			tmf.abovemidtex |= open.abovemidtex;
		}

		if (open.lowfloor < tmf.dropoffz && open.lowfloor > LINEOPEN_MIN)
		{
			tmf.dropoffz = open.lowfloor;
			if (ffcf_verbose) Printf("    Adjust dropoffz to %f\n", open.bottom);
			if (tmf.floorz > tmf.dropoffz + tmf.thing->MaxDropOffHeight) mit.StopDown();
		}
	}
	return true;
}